

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermNode * __thiscall
glslang::HlslParseContext::executeInitializer
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  TIntermediate *pTVar1;
  TString name;
  TString structName;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TSmallArrayVector *pTVar10;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  pool_allocator<char> pVar11;
  allocator_type aVar12;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TIntermTyped *pTVar13;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  char *pcVar14;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  TIntermSymbol *left;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  uint uVar15;
  int d;
  undefined8 in_stack_fffffffffffffe48;
  HlslParseContext *pHVar16;
  TSourceLoc *in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe70 [24];
  TString local_168;
  TString local_140;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_118 [40];
  TString local_f0;
  TType skeletalType;
  
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar4));
  uVar15 = *(uint *)(lVar9 + 8) & 0x7f;
  iVar4 = 1;
  TType::TType(&skeletalType,EbtVoid,EvqTemporary,1,0,0,false);
  iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  TType::shallowCopy(&skeletalType,(TType *)CONCAT44(extraout_var_00,iVar5));
  TQualifier::makeTemporary(&skeletalType.qualifier);
  iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  if (((CONCAT44(extraout_var_01,iVar5) != 0) &&
      (iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer),
      *(int *)(CONCAT44(extraout_var_02,iVar5) + 0xb8) == 0)) &&
     (initializer = convertInitializerList(this,loc,&skeletalType,initializer,(TIntermTyped *)0x0),
     initializer == (TIntermTyped *)0x0)) {
    if (uVar15 != 2) {
      return (TIntermNode *)0x0;
    }
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar4) + 0x50))
                      ((long *)CONCAT44(extraout_var_29,iVar4));
    *(byte *)(lVar9 + 8) = *(byte *)(lVar9 + 8) & 0x80;
    return (TIntermNode *)0x0;
  }
  iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xf0))
                    ((long *)CONCAT44(extraout_var_03,iVar5));
  if (cVar2 != '\0') {
    iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0xf8))
                      ((long *)CONCAT44(extraout_var_04,iVar5));
    if (cVar2 != '\0') {
      iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
      iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x78))
                        ((long *)CONCAT44(extraout_var_06,iVar6));
      TType::changeOuterArraySize((TType *)CONCAT44(extraout_var_05,iVar5),iVar6);
    }
  }
  iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
  bVar3 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_07,iVar5));
  if (bVar3) {
    iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    bVar3 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_08,iVar5));
    if (bVar3) {
      iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 0x98))
                        ((long *)CONCAT44(extraout_var_09,iVar5));
      lVar9 = *(long *)(lVar9 + 8);
      iVar5 = 0;
      iVar6 = 0;
      if (lVar9 != 0) {
        iVar6 = (int)((ulong)(*(long *)(lVar9 + 0x10) - *(long *)(lVar9 + 8)) >> 4);
      }
      iVar7 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar7) + 0x98))
                        ((long *)CONCAT44(extraout_var_10,iVar7));
      lVar9 = *(long *)(lVar9 + 8);
      if (lVar9 != 0) {
        iVar5 = (int)((ulong)(*(long *)(lVar9 + 0x10) - *(long *)(lVar9 + 8)) >> 4);
      }
      in_stack_fffffffffffffe58 = loc;
      if (iVar6 == iVar5) {
        while( true ) {
          iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 0x98))
                            ((long *)CONCAT44(extraout_var_11,iVar5));
          lVar9 = *(long *)(lVar9 + 8);
          if (lVar9 == 0) {
            iVar5 = 0;
          }
          else {
            iVar5 = (int)((ulong)(*(long *)(lVar9 + 0x10) - *(long *)(lVar9 + 8)) >> 4);
          }
          if (iVar5 <= iVar4) break;
          iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          pTVar10 = (TSmallArrayVector *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar5) + 0x98))
                              ((long *)CONCAT44(extraout_var_12,iVar5));
          uVar8 = TSmallArrayVector::getDimSize(pTVar10,iVar4);
          if (uVar8 == 0) {
            iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
            pTVar10 = (TSmallArrayVector *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar5) + 0xa0))
                                ((long *)CONCAT44(extraout_var_13,iVar5));
            iVar5 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
            this_00 = (TSmallArrayVector *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0x98))
                                ((long *)CONCAT44(extraout_var_14,iVar5));
            uVar8 = TSmallArrayVector::getDimSize(this_00,iVar4);
            TSmallArrayVector::setDimSize(pTVar10,iVar4,uVar8);
          }
          iVar4 = iVar4 + 1;
        }
      }
    }
  }
  if (uVar15 == 2) {
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_17,iVar4));
    if ((*(uint *)(lVar9 + 8) & 0x7f) != 2) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar4) + 0x50))
                        ((long *)CONCAT44(extraout_var_27,iVar4));
      *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) & 0xffffffffffffff80 | 0x13;
      goto LAB_0032502a;
    }
  }
  else {
    if (uVar15 != 5) {
LAB_0032502a:
      iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
      specializationCheck(this,loc,(TType *)CONCAT44(extraout_var_28,iVar4),"initializer");
      left = TIntermediate::addSymbol
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,
                        loc);
      pTVar13 = handleAssign(this,loc,EOpAssign,&left->super_TIntermTyped,initializer);
      if (pTVar13 == (TIntermTyped *)0x0) {
        TIntermTyped::getCompleteString_abi_cxx11_(&local_140,&left->super_TIntermTyped,false);
        TIntermTyped::getCompleteString_abi_cxx11_(&local_168,initializer,false);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"","=","cannot convert from \'%s\' to \'%s\'",local_168._M_dataplus._M_p
                   ,local_140._M_dataplus._M_p._0_4_);
        return (TIntermNode *)0x0;
      }
      return &pTVar13->super_TIntermNode;
    }
    pHVar16 = this;
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0x58))
                      ((long *)CONCAT44(extraout_var_15,iVar4));
    if ((*(uint *)(lVar9 + 8) & 0x7f) != 2) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pVar11.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &stack0xfffffffffffffe70,"",(pool_allocator<char> *)&stack0xfffffffffffffe68);
      aVar12.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                (local_118,"",(pool_allocator<char> *)&stack0xfffffffffffffe60);
      name._M_dataplus._M_p = (pointer)local_118;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xfffffffffffffe70;
      name._M_string_length = in_stack_fffffffffffffe48;
      name.field_2._M_allocated_capacity = (size_type)pHVar16;
      name.field_2._8_8_ = in_stack_fffffffffffffe58;
      structName._M_dataplus._M_p = (pointer)pVar11.allocator;
      structName._M_dataplus.super_allocator_type.allocator = aVar12.allocator;
      structName._M_string_length = in_stack_fffffffffffffe70._0_8_;
      structName.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
            )in_stack_fffffffffffffe70._8_16_;
      TType::getCompleteString
                (&local_f0,(TType *)CONCAT44(extraout_var_16,iVar4),false,true,true,true,name,
                 structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"uniform initializers must be constant","=","\'%s\'",
                 local_f0._M_dataplus._M_p);
      goto LAB_00324fed;
    }
  }
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  pTVar13 = TIntermediate::addConversion
                      (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_18,iVar4),initializer);
  if (pTVar13 != (TIntermTyped *)0x0) {
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    iVar5 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
    bVar3 = TType::operator!=((TType *)CONCAT44(extraout_var_19,iVar4),
                              (TType *)CONCAT44(extraout_var_20,iVar5));
    if (bVar3) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pTVar13 = TIntermediate::addUniShapeConversion
                          (pTVar1,EOpAssign,(TType *)CONCAT44(extraout_var_21,iVar4),pTVar13);
      if (pTVar13 == (TIntermTyped *)0x0) goto LAB_00324fb5;
    }
    iVar4 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[5])(pTVar13);
    if (CONCAT44(extraout_var_22,iVar4) != 0) {
      iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      iVar5 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
      bVar3 = TType::operator!=((TType *)CONCAT44(extraout_var_23,iVar4),
                                (TType *)CONCAT44(extraout_var_24,iVar5));
      if (!bVar3) {
        iVar4 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[5])(pTVar13);
        (*(variable->super_TSymbol)._vptr_TSymbol[0x19])
                  (variable,CONCAT44(extraout_var_30,iVar4) + 0xb8);
        return (TIntermNode *)0x0;
      }
    }
  }
LAB_00324fb5:
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  pcVar14 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_25,iVar4));
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"non-matching or non-convertible constant type for const initializer",pcVar14,
             "");
LAB_00324fed:
  iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar4) + 0x50))
                    ((long *)CONCAT44(extraout_var_26,iVar4));
  *(byte *)(lVar9 + 8) = *(byte *)(lVar9 + 8) & 0x80;
  return (TIntermNode *)0x0;
}

Assistant:

TIntermNode* HlslParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    if (initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull)
        initializer = convertInitializerList(loc, skeletalType, initializer, nullptr);
    if (initializer == nullptr) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
        variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniform and global consts require a constant initializer
    if (qualifier == EvqUniform && initializer->getType().getQualifier().storage != EvqConst) {
        error(loc, "uniform initializers must be constant", "=", "'%s'", variable->getType().getCompleteString().c_str());
        variable->getWritableType().getQualifier().storage = EvqTemporary;
        return nullptr;
    }

    // Const variables require a constant initializer
    if (qualifier == EvqConst) {
        if (initializer->getType().getQualifier().storage != EvqConst) {
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (initializer != nullptr && variable->getType() != initializer->getType())
            initializer = intermediate.addUniShapeConversion(EOpAssign, variable->getType(), initializer);
        if (initializer == nullptr || !initializer->getAsConstantUnion() ||
                                      variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().storage = EvqTemporary;
            return nullptr;
        }

        variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermNode* initNode = handleAssign(loc, EOpAssign, intermSymbol, initializer);
        if (initNode == nullptr)
            assignError(loc, "=", intermSymbol->getCompleteString(), initializer->getCompleteString());
        return initNode;
    }

    return nullptr;
}